

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  sqlite3_tokenizer_module *psVar1;
  sqlite3_tokenizer **ppsVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char **ppcVar8;
  char **p;
  long lVar9;
  sqlite3_uint64 n_00;
  int n;
  char *local_58;
  char **local_50;
  sqlite3_tokenizer_module *local_48;
  sqlite3_tokenizer **local_40;
  char *local_38;
  
  n = 0;
  pcVar4 = sqlite3_mprintf("%s");
  iVar3 = 7;
  if (pcVar4 != (char *)0x0) {
    local_40 = ppTok;
    sVar5 = strlen(pcVar4);
    pcVar6 = sqlite3Fts3NextToken(pcVar4,&n);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = pcVar4;
    }
    lVar9 = (long)n;
    pcVar6[lVar9] = '\0';
    sqlite3Fts3Dequote(pcVar6);
    sVar7 = strlen(pcVar6);
    local_48 = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,pcVar6,(int)sVar7 + 1);
    if (local_48 == (sqlite3_tokenizer_module *)0x0) {
      sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer: %s",pcVar6);
      iVar3 = 1;
    }
    else {
      local_38 = pcVar4 + sVar5;
      pcVar6 = pcVar6 + lVar9;
      n_00 = 8;
      lVar9 = 0;
      p = (char **)0x0;
      local_58 = pcVar4;
      local_50 = pzErr;
      while ((pcVar6 + 1 < local_38 &&
             (pcVar4 = sqlite3Fts3NextToken(pcVar6 + 1,&n), pcVar4 != (char *)0x0))) {
        ppcVar8 = (char **)sqlite3_realloc64(p,n_00);
        if (ppcVar8 == (char **)0x0) {
          sqlite3_free(local_58);
          sqlite3_free(p);
          return 7;
        }
        ppcVar8[lVar9] = pcVar4;
        pcVar6 = pcVar4 + n;
        pcVar4[n] = '\0';
        sqlite3Fts3Dequote(pcVar4);
        n_00 = n_00 + 8;
        lVar9 = lVar9 + 1;
        p = ppcVar8;
      }
      ppsVar2 = local_40;
      psVar1 = local_48;
      iVar3 = (*local_48->xCreate)((int)lVar9,p,local_40);
      if (iVar3 == 0) {
        (*ppsVar2)->pModule = psVar1;
      }
      else {
        sqlite3Fts3ErrMsg(local_50,"unknown tokenizer");
      }
      pcVar4 = local_58;
      sqlite3_free(p);
    }
    sqlite3_free(pcVar4);
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      sqlite3_int64 nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc64((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer");
    }else{
      (*ppTok)->pModule = m; 
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}